

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncInput(xmlParserInputBufferPtr input,size_t *sizeOut)

{
  xmlBufPtr pxVar1;
  xmlCharEncodingHandlerPtr pxVar2;
  xmlCharEncodingInputFunc p_Var3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  xmlChar *pxVar7;
  size_t sVar8;
  xmlChar *pxVar9;
  unsigned_long uVar10;
  char cVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  int c_in;
  int c_out;
  int local_78;
  int local_74;
  ulong local_70;
  size_t local_68;
  size_t local_60;
  uint local_54;
  xmlParserInputBufferPtr local_50;
  xmlBufPtr local_48;
  xmlBufPtr local_40;
  size_t *local_38;
  
  local_48 = input->buffer;
  pxVar1 = input->raw;
  sVar13 = *sizeOut;
  *sizeOut = 0;
  local_50 = input;
  sVar6 = xmlBufUse(pxVar1);
  if (sVar6 != 0) {
    local_40 = pxVar1;
    local_38 = sizeOut;
    pxVar7 = xmlBufContent(pxVar1);
    uVar14 = 0;
    sVar8 = 0;
    do {
      pxVar1 = local_48;
      local_70 = uVar14;
      local_60 = sVar8;
      sVar8 = xmlBufAvail(local_48);
      if (0x3ffffffe < sVar8) {
        sVar8 = 0x3fffffff;
      }
      local_74 = (int)sVar13;
      if (sVar8 < sVar13) {
        local_74 = (int)sVar8;
      }
      local_78 = 0x3fffffff;
      if (sVar6 < 0x40000000) {
        local_78 = (int)sVar6;
      }
      pxVar2 = local_50->encoder;
      pxVar9 = xmlBufEnd(pxVar1);
      p_Var3 = pxVar2->input;
      if (p_Var3 == (xmlCharEncodingInputFunc)0x0) {
        local_74 = 0;
        local_78 = 0;
        uVar4 = 0xffffffff;
      }
      else {
        uVar4 = (*p_Var3)(pxVar9,&local_74,pxVar7,&local_78);
        uVar4 = (int)uVar4 >> 0x1f & uVar4;
      }
      lVar12 = (long)local_78;
      local_68 = (size_t)local_74;
      xmlBufAddLen(local_48,local_68);
      uVar14 = local_70;
      switch(uVar4) {
      case 0xfffffffc:
        iVar5 = 2;
        break;
      case 0xfffffffd:
      case 0:
        if ((((0x3fffffff < sVar6) || (cVar11 = '\x03', sVar8 < sVar13)) &&
            (cVar11 = (uVar4 == 0 && sVar6 < 0x40000000 || uVar4 == 0xfffffffd && sVar13 <= sVar8) *
                      '\x03',
            (uVar4 != 0 || sVar6 >= 0x40000000) && (uVar4 != 0xfffffffd || sVar13 > sVar8))) &&
           (uVar4 == 0xfffffffd)) {
          iVar5 = xmlBufGrow(local_48,0x1000);
          cVar11 = '\0';
          if (iVar5 < 0) {
            local_50->error = 2;
            cVar11 = '\x01';
            local_54 = 0xfffffffc;
          }
        }
        goto LAB_0012bfe2;
      case 0xfffffffe:
        iVar5 = 0x51;
        break;
      default:
        iVar5 = 1;
      }
      local_50->error = iVar5;
      cVar11 = '\x01';
      local_54 = uVar4;
LAB_0012bfe2:
      uVar14 = uVar14 + lVar12;
      pxVar7 = pxVar7 + lVar12;
      sVar6 = sVar6 - lVar12;
      sVar8 = local_60 + local_68;
      sVar13 = sVar13 - local_68;
    } while (cVar11 == '\0');
    if (cVar11 != '\x03') {
      return local_54;
    }
    xmlBufShrink(local_40,uVar14);
    uVar10 = 0xffffffffffffffff;
    if (!CARRY8(uVar14,local_50->rawconsumed)) {
      uVar10 = uVar14 + local_50->rawconsumed;
    }
    local_50->rawconsumed = uVar10;
    *local_38 = sVar8;
  }
  return 0;
}

Assistant:

int
xmlCharEncInput(xmlParserInputBufferPtr input, size_t *sizeOut)
{
    xmlBufPtr out, in;
    const xmlChar *dataIn;
    size_t availIn;
    size_t maxOut;
    size_t totalIn, totalOut;
    int ret;

    out = input->buffer;
    in = input->raw;

    maxOut = *sizeOut;
    totalOut = 0;

    *sizeOut = 0;

    availIn = xmlBufUse(in);
    if (availIn == 0)
        return(0);
    dataIn = xmlBufContent(in);
    totalIn = 0;

    while (1) {
        size_t availOut;
        int completeOut, completeIn;
        int c_out, c_in;

        availOut = xmlBufAvail(out);
        if (availOut > INT_MAX / 2)
            availOut = INT_MAX / 2;

        if (availOut < maxOut) {
            c_out = availOut;
            completeOut = 0;
        } else {
            c_out = maxOut;
            completeOut = 1;
        }

        if (availIn > INT_MAX / 2) {
            c_in = INT_MAX / 2;
            completeIn = 0;
        } else {
            c_in = availIn;
            completeIn = 1;
        }

        ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                               dataIn, &c_in);

        totalIn += c_in;
        dataIn += c_in;
        availIn -= c_in;

        totalOut += c_out;
        maxOut -= c_out;
        xmlBufAddLen(out, c_out);

        if ((ret != XML_ENC_ERR_SUCCESS) && (ret != XML_ENC_ERR_SPACE)) {
            input->error = xmlEncConvertError(ret);
            return(ret);
        }

        if ((completeOut) && (completeIn))
            break;
        if ((completeOut) && (ret == XML_ENC_ERR_SPACE))
            break;
        if ((completeIn) && (ret == XML_ENC_ERR_SUCCESS))
            break;

        if (ret == XML_ENC_ERR_SPACE) {
            if (xmlBufGrow(out, 4096) < 0) {
                input->error = XML_ERR_NO_MEMORY;
                return(XML_ENC_ERR_MEMORY);
            }
        }
    }

    xmlBufShrink(in, totalIn);

    if (input->rawconsumed > ULONG_MAX - (unsigned long) totalIn)
        input->rawconsumed = ULONG_MAX;
    else
        input->rawconsumed += totalIn;

    *sizeOut = totalOut;
    return(XML_ERR_OK);
}